

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int32_t ne_core_main(int32_t argc,char **argv)

{
  int64_t iVar1;
  bool simulated_environment;
  
  if (argc < 2) {
    simulated_environment = false;
  }
  else {
    iVar1 = test_string_compare(argv[1],"--simulated");
    simulated_environment = iVar1 == 0;
  }
  test_core(simulated_environment);
  test_io(simulated_environment);
  test_time(simulated_environment);
  test_filesystem(simulated_environment);
  return 0;
}

Assistant:

int32_t ne_core_main(int32_t argc, char *argv[])
{
  auto simulated_environment = static_cast<ne_core_bool>(
      argc >= 2 && test_string_compare(argv[1], "--simulated") == 0);

  // Invalid, but until we get a way for modules to run their own initialize
  // and register tests (dependency upon test) then  we must do this.
  extern void test_core(ne_core_bool simulated_environment);
  extern void test_io(ne_core_bool simulated_environment);
  extern void test_time(ne_core_bool simulated_environment);
  extern void test_filesystem(ne_core_bool simulated_environment);
  test_core(simulated_environment);
  test_io(simulated_environment);
  test_time(simulated_environment);
  test_filesystem(simulated_environment);

  // We can't know whether the test completed by this point do to callbacks.
  return 0;
}